

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

void __thiscall r_comp::Decompiler::write_expression_head(Decompiler *this,uint16_t read_index)

{
  OutStream *pOVar1;
  Metadata *pMVar2;
  undefined1 uVar3;
  ushort uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  uint16_t read_index_local;
  Decompiler *this_local;
  
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)read_index);
  uVar3 = r_code::Atom::getDescriptor();
  switch(uVar3) {
  case 0xc3:
  case 0xc4:
    pOVar1 = this->out_stream;
    pMVar2 = this->metadata;
    r_code::vector<r_code::Atom>::operator[]
              ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)read_index);
    uVar4 = r_code::Atom::asOpcode();
    pbVar5 = r_code::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&pMVar2->class_names,(ulong)uVar4);
    OutStream::operator<<(pOVar1,pbVar5);
    break;
  case 0xc5:
    pOVar1 = this->out_stream;
    pMVar2 = this->metadata;
    r_code::vector<r_code::Atom>::operator[]
              ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)read_index);
    uVar4 = r_code::Atom::asOpcode();
    pbVar5 = r_code::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&pMVar2->operator_names,(ulong)uVar4);
    OutStream::operator<<(pOVar1,pbVar5);
    break;
  default:
    OutStream::operator<<(this->out_stream,(char (*) [16])"undefined-class");
    break;
  case 200:
    OutStream::operator<<(this->out_stream,(char (*) [4])0x1caf07);
    break;
  case 0xc9:
  case 0xcb:
  case 0xcc:
    OutStream::operator<<(this->out_stream,(char (*) [5])"ipgm");
    break;
  case 0xca:
    OutStream::operator<<(this->out_stream,(char (*) [9])"icpp_pgm");
    break;
  case 0xcd:
    OutStream::operator<<(this->out_stream,(char (*) [4])0x1cadf4);
    break;
  case 0xce:
    OutStream::operator<<(this->out_stream,(char (*) [4])0x1cadf9);
  }
  return;
}

Assistant:

void Decompiler::write_expression_head(uint16_t read_index)
{
    switch (current_object->code[read_index].getDescriptor()) {
    case Atom::OPERATOR:
        *out_stream << metadata->operator_names[current_object->code[read_index].asOpcode()];
        break;

    case Atom::OBJECT:
    case Atom::MARKER:
        *out_stream << metadata->class_names[current_object->code[read_index].asOpcode()];
        break;

    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
        *out_stream << "ipgm";
        break;

    case Atom::INSTANTIATED_CPP_PROGRAM:
        *out_stream << "icpp_pgm";
        break;

    case Atom::COMPOSITE_STATE:
        *out_stream << "cst";
        break;

    case Atom::MODEL:
        *out_stream << "mdl";
        break;

    case Atom::GROUP:
        *out_stream << "grp";
        break;

    default:
        *out_stream << "undefined-class";
        break;
    }
}